

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O3

service * boost::asio::detail::service_registry::
          create<boost::asio::detail::reactive_descriptor_service,boost::asio::io_context>
                    (void *owner)

{
  service *psVar1;
  service *psVar2;
  key local_20;
  
  psVar1 = (service *)operator_new(0x30);
  (psVar1->key_).type_info_ = (type_info *)0x0;
  (psVar1->key_).id_ = (id *)0x0;
  psVar1->owner_ = (execution_context *)owner;
  psVar1->next_ = (service *)0x0;
  psVar1->_vptr_service = (_func_int **)&PTR__noncopyable_00121bd8;
  local_20.type_info_ = (type_info *)&typeid_wrapper<boost::asio::detail::epoll_reactor>::typeinfo;
  local_20.id_ = (id *)0x0;
  psVar2 = do_use_service(*owner,&local_20,
                          create<boost::asio::detail::epoll_reactor,boost::asio::io_context>,owner);
  psVar1[1]._vptr_service = (_func_int **)psVar2;
  scheduler::init_task((scheduler *)psVar2[1]._vptr_service);
  return psVar1;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}